

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O0

void StatsObserver::printTable(void)

{
  ostream *poVar1;
  int local_f0;
  allocator<char> local_e9;
  int i;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::operator<<((ostream *)&std::cout,
                  "\n\n--------------------------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"--------------------Game Statistics---------------------\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "--------------------------------------------------------\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Player",&local_49);
  center(&local_28,&local_48,10);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_28);
  poVar1 = std::operator<<(poVar1," | ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Countries Owned",&local_a1);
  center(&local_80,&local_a0,0x14);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  poVar1 = std::operator<<(poVar1," | ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"% of the Map Owned",&local_e9);
  center(&local_c8,(string *)&i,0x14);
  poVar1 = std::operator<<(poVar1,(string *)&local_c8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  for (local_f0 = 0; local_f0 < 0x38; local_f0 = local_f0 + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  printStats();
  return;
}

Assistant:

void StatsObserver::printTable() {
    std::cout << "\n\n--------------------------------------------------------\n";
    std::cout << "--------------------Game Statistics---------------------\n";
    std::cout << "--------------------------------------------------------\n\n";

    std::cout << center("Player", 10) << " | "
              << center("Countries Owned", 20) << " | "
              << center("% of the Map Owned", 20) << "\n";

    for (int i = 0; i < 56; i++) {
        std::cout << "-";
    }
    std::cout << "\n";

    StatsObserver::printStats();
}